

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void testing::anon_unknown_32::PrintByteSegmentInObjectTo
               (uchar *obj_bytes,size_t start,size_t count,ostream *os)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  char local_38 [6];
  char local_32 [2];
  char text [5];
  
  local_38[4] = 0;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  if (count != 0) {
    lVar3 = 0;
    do {
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      if (bVar4) {
        if ((start & 1) == 0) {
          local_32[1] = 0x20;
          pcVar2 = local_32 + 1;
        }
        else {
          local_32[0] = '-';
          pcVar2 = local_32;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,1);
      }
      snprintf(local_38,5,"%02X",(ulong)obj_bytes[start]);
      sVar1 = strlen(local_38);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_38,sVar1);
      start = start + 1;
    } while (-lVar3 != count);
  }
  return;
}

Assistant:

void PrintByteSegmentInObjectTo(const unsigned char* obj_bytes, size_t start,
			size_t count, ostream* os) {
			char text[5] = "";
			for (size_t i = 0; i != count; i++) {
				const size_t j = start + i;
				if (i != 0) {
					// Organizes the bytes into groups of 2 for easy parsing by
					// human.
					if ((j % 2) == 0)
						*os << ' ';
					else
						*os << '-';
				}
				GTEST_SNPRINTF_(text, sizeof(text), "%02X", obj_bytes[j]);
				*os << text;
			}
		}